

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_deregisterArchiver(char *ext)

{
  int iVar1;
  size_t sStack_20;
  int retval;
  size_t i;
  char *ext_local;
  
  if (initialized == 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_INITIALIZED);
  }
  else if (ext == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    for (sStack_20 = 0; sStack_20 < numArchivers; sStack_20 = sStack_20 + 1) {
      iVar1 = PHYSFS_utf8stricmp(archiveInfo[sStack_20]->extension,ext);
      if (iVar1 == 0) {
        iVar1 = doDeregisterArchiver(sStack_20);
        __PHYSFS_platformReleaseMutex(stateLock);
        return iVar1;
      }
    }
    __PHYSFS_platformReleaseMutex(stateLock);
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
  }
  return 0;
}

Assistant:

int PHYSFS_deregisterArchiver(const char *ext)
{
    size_t i;

    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);
    BAIL_IF(!ext, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);
    for (i = 0; i < numArchivers; i++)
    {
        if (PHYSFS_utf8stricmp(archiveInfo[i]->extension, ext) == 0)
        {
            const int retval = doDeregisterArchiver(i);
            __PHYSFS_platformReleaseMutex(stateLock);
            return retval;
        } /* if */
    } /* for */
    __PHYSFS_platformReleaseMutex(stateLock);

    BAIL(PHYSFS_ERR_NOT_FOUND, 0);
}